

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestProtocols.h
# Opt level: O3

void __thiscall B::B(B *this,ostream *outStream)

{
  (this->super_StreamWriter).stream = outStream;
  BaseObserverProtocol::BaseObserverProtocol((BaseObserverProtocol *)this);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__BaseObserverProtocol_0015bdf0;
  BaseObserverProtocol::BaseObserverProtocol
            (&(this->super_TicTacProtocol).super_BaseObserverProtocol);
  (this->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_0015be60;
  (this->super_TicTacProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol =
       (_func_int **)&PTR__B_0015be98;
  return;
}

Assistant:

B(std::ostream& outStream) :
    StreamWriter(outStream) {}